

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O3

cx_string<19UL> * mserialize::CustomTag<Nest::Nested,_void>::tag_string(void)

{
  cx_string<19UL> *in_RDI;
  cx_string<1UL> *in_stack_ffffffffffffffd0;
  undefined1 local_28 [4];
  cx_string<1UL> local_24;
  undefined2 local_22;
  undefined4 local_20;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined8 local_18;
  undefined2 local_10;
  
  local_22 = 0x2f;
  local_24._data[0] = 'I';
  local_24._data[1] = '\0';
  local_18 = 0x5464657473654e60;
  local_10 = 0x27;
  local_28[2] = '0';
  local_28[3] = '\0';
  local_1a = 0;
  local_1c = 0x2764;
  local_20 = 0x72694260;
  local_28[0] = '\\';
  local_28[1] = '\0';
  cx_strcat<1ul,1ul,9ul,1ul,6ul,1ul>
            (in_RDI,(mserialize *)&local_22,&local_24,(cx_string<1UL> *)&local_18,
             (cx_string<9UL> *)(local_28 + 2),(cx_string<1UL> *)&local_20,(cx_string<6UL> *)local_28
             ,in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}